

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O0

int vrna_mkdir_p(char *path)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  bool bVar6;
  char *pcStack_b8;
  int done;
  char *ptr;
  char *slash;
  stat sb;
  char *path_local;
  
  bVar6 = false;
  sb.__glibc_reserved[2] = (__syscall_slong_t)path;
  iVar1 = is_absolute_path(path);
  if (iVar1 == 0) {
    pcStack_b8 = vrna_strdup_printf(".%c%s",0x2f,sb.__glibc_reserved[2]);
  }
  else {
    pcStack_b8 = strdup((char *)sb.__glibc_reserved[2]);
  }
  ptr = pcStack_b8;
  do {
    if (bVar6) {
      free(pcStack_b8);
      return 0;
    }
    sVar2 = strspn(ptr,"/");
    sVar3 = strcspn(ptr + sVar2,"/");
    ptr = ptr + sVar2 + sVar3;
    bVar6 = *ptr == '\0';
    *ptr = '\0';
    iVar1 = stat(pcStack_b8,(stat *)&slash);
    if (iVar1 == 0) {
      if (((uint)sb.st_nlink & 0xf000) != 0x4000) {
        pcVar5 = strerror(0x14);
        vrna_message_warning("File exists but is not a directory %s: %s",pcStack_b8,pcVar5);
        free(pcStack_b8);
        return -1;
      }
    }
    else {
      piVar4 = __errno_location();
      if ((*piVar4 != 2) ||
         ((iVar1 = mkdir(pcStack_b8,0x1ff), iVar1 != 0 &&
          (piVar4 = __errno_location(), *piVar4 != 0x11)))) {
        vrna_message_warning("Can\'t create directory %s",pcStack_b8);
        free(pcStack_b8);
        return -1;
      }
    }
    *ptr = '/';
  } while( true );
}

Assistant:

PUBLIC int
vrna_mkdir_p(const char *path)
{
  struct stat sb;
  char        *slash, *ptr;
  int         done = 0;

  if (!is_absolute_path(path))
    ptr = vrna_strdup_printf(".%c%s", DIRSEPC, path);
  else
    ptr = strdup(path);

  slash = ptr;

  while (!done) {
    slash += strspn(slash, DIRSEPS);
    slash += strcspn(slash, DIRSEPS);

    done    = (*slash == '\0');
    *slash  = '\0';

    if (stat(ptr, &sb)) {
#ifdef _WIN32
      if (errno != ENOENT || (_mkdir(ptr) &&
                              errno != EEXIST)) {
#else
      if (errno != ENOENT || (mkdir(ptr, 0777) &&
                              errno != EEXIST)) {
#endif
        vrna_message_warning("Can't create directory %s", ptr);
        free(ptr);
        return -1;
      }
    } else if (!S_ISDIR(sb.st_mode)) {
      vrna_message_warning("File exists but is not a directory %s: %s", ptr, strerror(ENOTDIR));
      free(ptr);
      return -1;
    }

    *slash = DIRSEPC;
  }

  free(ptr);
  return 0;
}


PUBLIC char *
vrna_basename(const char *path)
{
  char *name, *ptr;

  name = NULL;

  if (path) {
    ptr = strrchr(path, DIRSEPC);

    if (ptr && (*(ptr + 1) != '\0'))
      name = strdup(ptr + 1);
    else if (!ptr)
      name = strdup(path);
  }

  return name;
}


PUBLIC char *
vrna_dirname(const char *path)
{
  char  *name, *p, *ptr;
  int   pos;

  name = NULL;

  if (path) {
    if (!is_absolute_path(path))
      ptr = vrna_strdup_printf(".%c%s", DIRSEPC, path);
    else
      ptr = strdup(path);

    pos = (int)strlen(ptr);
    p   = ptr + pos;

    do  /* remove part after last separator */
      *p = '\0';
    while ((--p > ptr) && (*p != DIRSEPC));

    if (p > ptr)
      name = ptr;
  }

  return name;
}


PUBLIC char *
vrna_filename_sanitize(const char *name,
                       const char *replacement)
{
  if (name) {
    const char    *ptr, *start, *illegal_chars;
    char          *sanitized_name;
    unsigned int  i, n;

    illegal_chars   = "\\/?%*:|\"<> ";
    sanitized_name  = (char *)vrna_alloc(sizeof(char) * (strlen(name) + 1));
    start           = name;
    i               = 0;
    while ((ptr = strpbrk(start, illegal_chars))) {
      /* find illegal chars */
      strncpy(sanitized_name + i, start, ptr - start);
      i += ptr - start;
      if (replacement && (*replacement))
        sanitized_name[i++] = *replacement;

      start = ptr + 1; /* skip invalid character */
    }
    /* copy remaining part */
    if (start < (name + strlen(name))) {
      unsigned int diff = name - start + strlen(name);
      strncpy(sanitized_name + i, start, diff);
      i += diff;
    }

    /* resize the output string to actual requirements */
    sanitized_name    = (char *)vrna_realloc(sanitized_name, sizeof(char) * (i + 1));
    sanitized_name[i] = '\0';

    /* check for reserved unix file names */
    if ((!strcmp(sanitized_name, ".")) || (!strcmp(sanitized_name, ".."))) {
      sanitized_name    = (char *)vrna_realloc(sanitized_name, sizeof(char));
      sanitized_name[0] = '\0';
    }

    /* check for length restrictions */
    n = strlen(sanitized_name);
    if (n > 255) {
      char *suff = NULL;
      /* try to leave file suffix, i.e. everything after last dot '.', intact */
      if ((suff = strrchr(sanitized_name, '.')) && (sanitized_name + n - suff < 255)) {
        unsigned int n_suff = sanitized_name + n - suff;
        memmove(sanitized_name + (255 - n_suff), sanitized_name + n - n_suff,
                sizeof(char) * n_suff);
      }

      sanitized_name      = (char *)vrna_realloc(sanitized_name, sizeof(char) * 256);
      sanitized_name[255] = '\0';
    }

    /* finally, return the sanitized file name */
    return sanitized_name;
  } else {
    return NULL;
  }
}


PUBLIC int
vrna_file_exists(const char *filename)
{
  int           r = 0;

#ifdef _WIN32
  struct _stat  buf;
  r = _stat(filename, &buf) == 0 ? 1 : 0;
#else
  struct stat   buf;
  r = stat(filename, &buf) == 0 ? 1 : 0;
#endif
  return r;
}


#ifdef _WIN32
PRIVATE int
is_drive_char(const char c)
{
  if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z'))
    return 1;

  return 0;
}


#endif


PRIVATE int
is_absolute_path(const char *p)
{
  if (*p == DIRSEPC)
    return 1;

#ifdef _WIN32
  if (is_drive_char((const char)*p) && (strlen(p) > 3))
    if ((*(p + 1) == ':') && ((*(p + 2) == '\\') || (*(p + 2) == '/')))
      return 1;

#endif
  return 0;
}